

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O3

void __thiscall phyr::FPError::FPError(FPError *this,double _v,double _error)

{
  long lVar1;
  double dVar2;
  
  this->v = _v;
  if ((_error != 0.0) || (NAN(_error))) {
    dVar2 = _v - _error;
    if (-INFINITY < dVar2) {
      dVar2 = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)dVar2 |
                      -(ulong)(dVar2 == 0.0) & 0x8000000000000000);
      dVar2 = (double)((long)dVar2 + (ulong)(dVar2 <= 0.0) * 2 + -1);
    }
    else {
      dVar2 = -INFINITY;
    }
    this->lBound = dVar2;
    dVar2 = _v + _error;
    lVar1 = 0x10;
    if (dVar2 < INFINITY) {
      dVar2 = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)dVar2);
      _v = (double)((-(ulong)(dVar2 < 0.0) | 1) + (long)dVar2);
    }
    else {
      _v = INFINITY;
    }
  }
  else {
    this->uBound = _v;
    lVar1 = 8;
  }
  *(double *)((long)&this->v + lVar1) = _v;
  return;
}

Assistant:

FPError(Real _v, Real _error = 0) {
        v = _v;
        if (_error == 0)
            lBound = uBound = v;
        else {
            lBound = nextFloatDown(v - _error);
            uBound = nextFloatUp(v + _error);
        }
    }